

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

UBool __thiscall icu_63::LocaleKey::isFallbackOf(LocaleKey *this,UnicodeString *id)

{
  short sVar1;
  char16_t cVar2;
  int32_t iVar3;
  int offset;
  bool bVar4;
  UnicodeString temp;
  UnicodeString local_50;
  
  UnicodeString::UnicodeString(&local_50,id);
  ICUServiceKey::parseSuffix(&local_50);
  iVar3 = UnicodeString::indexOf(&local_50,&this->_primaryID);
  if (iVar3 == 0) {
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    sVar1 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      offset = (this->_primaryID).fUnion.fFields.fLength;
    }
    else {
      offset = (int)sVar1 >> 5;
    }
    bVar4 = true;
    if (local_50.fUnion.fFields.fLength != offset) {
      cVar2 = UnicodeString::doCharAt(&local_50,offset);
      bVar4 = cVar2 == L'_';
    }
  }
  else {
    bVar4 = false;
  }
  UnicodeString::~UnicodeString(&local_50);
  return bVar4;
}

Assistant:

UBool
LocaleKey::isFallbackOf(const UnicodeString& id) const {
    UnicodeString temp(id);
    parseSuffix(temp);
    return temp.indexOf(_primaryID) == 0 &&
        (temp.length() == _primaryID.length() ||
        temp.charAt(_primaryID.length()) == UNDERSCORE_CHAR);
}